

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::ConflictPoolPropagation::linkWatchedLiteral
          (ConflictPoolPropagation *this,HighsInt linkPos)

{
  int iVar1;
  pointer pWVar2;
  pointer piVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  
  pWVar2 = (this->watchedLiterals_).
           super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = pWVar2[linkPos].domchg.column;
  pvVar4 = &this->colLowerWatched_;
  if (pWVar2[linkPos].domchg.boundtype != kLower) {
    pvVar4 = &this->colUpperWatched_;
  }
  piVar3 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pWVar2[linkPos].prev = -1;
  pWVar2[linkPos].next = piVar3[iVar1];
  if ((long)piVar3[iVar1] != -1) {
    pWVar2[piVar3[iVar1]].prev = linkPos;
    piVar3[iVar1] = linkPos;
  }
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::linkWatchedLiteral(
    HighsInt linkPos) {
  assert(watchedLiterals_[linkPos].domchg.column != -1);
  HighsInt& head =
      watchedLiterals_[linkPos].domchg.boundtype == HighsBoundType::kLower
          ? colLowerWatched_[watchedLiterals_[linkPos].domchg.column]
          : colUpperWatched_[watchedLiterals_[linkPos].domchg.column];

  watchedLiterals_[linkPos].prev = -1;
  watchedLiterals_[linkPos].next = head;
  if (head != -1) {
    watchedLiterals_[head].prev = linkPos;
    head = linkPos;
  }
}